

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConnectorFederateManager.cpp
# Opt level: O2

Translator * __thiscall
helics::ConnectorFederateManager::registerTranslator
          (ConnectorFederateManager *this,string_view name,string_view endpointType,
          string_view units)

{
  pointer this_00;
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  Translator *pTVar3;
  RegistrationFailure *this_01;
  char *pcVar4;
  size_t sVar5;
  string_view searchValue;
  string_view message;
  InterfaceHandle handle;
  string_view name_local;
  handle trans;
  
  pcVar4 = name._M_str;
  sVar5 = name._M_len;
  name_local._M_len = sVar5;
  name_local._M_str = pcVar4;
  uVar1 = (*this->coreObject->_vptr_Core[0x3c])();
  handle.hid = uVar1;
  if (uVar1 != 0x9aac0f00) {
    gmlc::libguarded::
    shared_guarded_opt<gmlc::containers::StringMappedVector<helics::Translator,_(reference_stability)0,_5>,_std::shared_mutex>
    ::lock(&trans,&this->translators);
    this_00 = trans.data;
    if (sVar5 == 0) {
      iVar2 = (*this->coreObject->_vptr_Core[0x28])(this->coreObject,(ulong)uVar1);
      pcVar4 = *(char **)CONCAT44(extraout_var,iVar2);
      sVar5 = ((undefined8 *)CONCAT44(extraout_var,iVar2))[1];
    }
    searchValue._M_str = pcVar4;
    searchValue._M_len = sVar5;
    gmlc::containers::StringMappedVector<helics::Translator,(reference_stability)0,5>::
    insert<helics::Federate*&,std::basic_string_view<char,std::char_traits<char>>&,helics::InterfaceHandle&>
              ((StringMappedVector<helics::Translator,(reference_stability)0,5> *)this_00,
               searchValue,&this->fed,&name_local,&handle);
    pTVar3 = gmlc::containers::
             StableBlockVector<helics::Translator,_5U,_std::allocator<helics::Translator>_>::back
                       (&(trans.data)->dataStorage);
    std::unique_lock<std::shared_mutex>::~unique_lock(&trans.m_handle_lock);
    return pTVar3;
  }
  this_01 = (RegistrationFailure *)__cxa_allocate_exception(0x28);
  message._M_str = "Unable to register translator";
  message._M_len = 0x1d;
  RegistrationFailure::RegistrationFailure(this_01,message);
  __cxa_throw(this_01,&RegistrationFailure::typeinfo,HelicsException::~HelicsException);
}

Assistant:

Translator& ConnectorFederateManager::registerTranslator(std::string_view name,
                                                         std::string_view endpointType,
                                                         std::string_view units)
{
    auto handle = coreObject->registerTranslator(name, endpointType, units);
    if (handle.isValid()) {
        auto trans = translators.lock();
        if (name.empty()) {
            trans->insert(coreObject->getHandleName(handle), fed, name, handle);
        } else {
            trans->insert(name, fed, name, handle);
        }
        return trans->back();
    }
    throw(RegistrationFailure("Unable to register translator"));
}